

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

CommandLineFlagInfo *
google::GetCommandLineFlagInfoOrDie(CommandLineFlagInfo *__return_storage_ptr__,char *name)

{
  bool bVar1;
  CommandLineFlagInfo *pCVar2;
  char *name_local;
  CommandLineFlagInfo *info;
  
  CommandLineFlagInfo::CommandLineFlagInfo(__return_storage_ptr__);
  bVar1 = GetCommandLineFlagInfo(name,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  fprintf(_stderr,"FATAL ERROR: flag name \'%s\' doesn\'t exist\n",name);
  pCVar2 = (CommandLineFlagInfo *)(*(code *)gflags_exitfunc)(1);
  return pCVar2;
}

Assistant:

CommandLineFlagInfo GetCommandLineFlagInfoOrDie(const char* name) {
  CommandLineFlagInfo info;
  if (!GetCommandLineFlagInfo(name, &info)) {
    fprintf(stderr, "FATAL ERROR: flag name '%s' doesn't exist\n", name);
    gflags_exitfunc(1);    // almost certainly gflags_exitfunc()
  }
  return info;
}